

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O3

off_t my_netread(int fd,void *buf,off_t len)

{
  int iVar1;
  ssize_t sVar2;
  off_t oVar3;
  
  if (len == 0) {
    oVar3 = 0;
  }
  else {
    oVar3 = 0;
    do {
      iVar1 = socket_wait(fd,1);
      if (iVar1 < 1) {
        return oVar3;
      }
      sVar2 = read(fd,(void *)((long)buf + oVar3),len);
      if (sVar2 == 0) {
        return oVar3;
      }
      oVar3 = oVar3 + sVar2;
      len = len - sVar2;
    } while (len != 0);
  }
  return oVar3;
}

Assistant:

static off_t my_netread(int fd, void *buf, off_t len)
{
	off_t rest = len, curr, l = 0;
	/* recv() and read() may not read the required length of data with
	 * one call. They have to be called repeatedly. */
	while (rest) {
		if (socket_wait(fd, 1) <= 0) break; // socket is not ready for reading
		curr = netread(fd, (void*)((char*)buf + l), rest);
		/* According to the glibc manual, section 13.2, a zero returned
		 * value indicates end-of-file (EOF), which should mean that
		 * read() will not return zero if EOF has not been met but data
		 * are not immediately available. */
		if (curr == 0) break;
		l += curr; rest -= curr;
	}
	return l;
}